

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O2

REF_BOOL ref_dict_has_key(REF_DICT ref_dict,REF_INT key)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = ref_dict->n;
  if (ref_dict->n < 1) {
    uVar2 = 0;
  }
  uVar3 = 0;
  do {
    if (uVar2 == uVar3) {
      return 0;
    }
    piVar1 = ref_dict->key + uVar3;
    uVar3 = uVar3 + 1;
  } while (*piVar1 != key);
  return 1;
}

Assistant:

REF_FCN REF_BOOL ref_dict_has_key(REF_DICT ref_dict, REF_INT key) {
  REF_INT i;

  for (i = 0; i < ref_dict_n(ref_dict); i++)
    if (key == ref_dict->key[i]) {
      return REF_TRUE;
    }

  return REF_FALSE;
}